

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeShallowSwapField
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  RepeatedField<long> *this_00;
  RepeatedField<long> *other;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_int> *other_00;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<unsigned_long> *other_01;
  RepeatedField<float> *this_03;
  RepeatedField<float> *other_02;
  RepeatedField<double> *this_04;
  RepeatedField<double> *other_03;
  RepeatedField<bool> *this_05;
  RepeatedField<bool> *other_04;
  RepeatedField<int> *pRVar3;
  RepeatedField<int> *pRVar4;
  LogMessage *pLVar5;
  CppType local_50 [4];
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message2_local;
  Message *message1_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message2;
  message2_local = message1;
  message1_local = (Message *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    CVar2 = FieldDescriptor::cpp_type(local_28);
    switch(CVar2) {
    case CPPTYPE_INT32:
      pRVar3 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message2_local,local_28);
      pRVar4 = MutableRaw<google::protobuf::RepeatedField<int>>
                         (this,(Message *)field_local,local_28);
      RepeatedField<int>::InternalSwap(pRVar3,pRVar4);
      break;
    case CPPTYPE_INT64:
      this_00 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message2_local,local_28);
      other = MutableRaw<google::protobuf::RepeatedField<long>>
                        (this,(Message *)field_local,local_28);
      RepeatedField<long>::InternalSwap(this_00,other);
      break;
    case CPPTYPE_UINT32:
      this_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                          (this,message2_local,local_28);
      other_00 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                           (this,(Message *)field_local,local_28);
      RepeatedField<unsigned_int>::InternalSwap(this_01,other_00);
      break;
    case CPPTYPE_UINT64:
      this_02 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                          (this,message2_local,local_28);
      other_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                           (this,(Message *)field_local,local_28);
      RepeatedField<unsigned_long>::InternalSwap(this_02,other_01);
      break;
    case CPPTYPE_DOUBLE:
      this_04 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message2_local,local_28);
      other_03 = MutableRaw<google::protobuf::RepeatedField<double>>
                           (this,(Message *)field_local,local_28);
      RepeatedField<double>::InternalSwap(this_04,other_03);
      break;
    case CPPTYPE_FLOAT:
      this_03 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message2_local,local_28);
      other_02 = MutableRaw<google::protobuf::RepeatedField<float>>
                           (this,(Message *)field_local,local_28);
      RepeatedField<float>::InternalSwap(this_03,other_02);
      break;
    case CPPTYPE_BOOL:
      this_05 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message2_local,local_28);
      other_04 = MutableRaw<google::protobuf::RepeatedField<bool>>
                           (this,(Message *)field_local,local_28);
      RepeatedField<bool>::InternalSwap(this_05,other_04);
      break;
    case CPPTYPE_ENUM:
      pRVar3 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message2_local,local_28);
      pRVar4 = MutableRaw<google::protobuf::RepeatedField<int>>
                         (this,(Message *)field_local,local_28);
      RepeatedField<int>::InternalSwap(pRVar3,pRVar4);
      break;
    case CPPTYPE_STRING:
      internal::SwapFieldHelper::SwapRepeatedStringField<true>
                (this,message2_local,(Message *)field_local,local_28);
      break;
    case CPPTYPE_MESSAGE:
      internal::SwapFieldHelper::SwapRepeatedMessageField<true>
                (this,message2_local,(Message *)field_local,local_28);
      break;
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d3);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [21])"Unimplemented type: ");
      local_50[0] = FieldDescriptor::cpp_type(local_28);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::
               operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
                         (pLVar5,local_50);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(local_28);
    if (CVar2 == CPPTYPE_MESSAGE) {
      internal::SwapFieldHelper::SwapMessageField<true>
                (this,message2_local,(Message *)field_local,local_28);
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(local_28);
      if (CVar2 == CPPTYPE_STRING) {
        internal::SwapFieldHelper::SwapStringField<true>
                  (this,message2_local,(Message *)field_local,local_28);
      }
      else {
        internal::SwapFieldHelper::SwapNonMessageNonStringField
                  (this,message2_local,(Message *)field_local,local_28);
      }
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeShallowSwapField(Message* message1, Message* message2,
                                        const FieldDescriptor* field) const {
  if (!field->is_repeated()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      internal::SwapFieldHelper::SwapMessageField<true>(this, message1,
                                                        message2, field);
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      internal::SwapFieldHelper::SwapStringField<true>(this, message1, message2,
                                                       field);
    } else {
      internal::SwapFieldHelper::SwapNonMessageNonStringField(this, message1,
                                                              message2, field);
    }
    return;
  }

  switch (field->cpp_type()) {
#define SHALLOW_SWAP_ARRAYS(CPPTYPE, TYPE)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    MutableRaw<RepeatedField<TYPE>>(message1, field)                      \
        ->InternalSwap(MutableRaw<RepeatedField<TYPE>>(message2, field)); \
    break;

    SHALLOW_SWAP_ARRAYS(INT32, int32_t);
    SHALLOW_SWAP_ARRAYS(INT64, int64_t);
    SHALLOW_SWAP_ARRAYS(UINT32, uint32_t);
    SHALLOW_SWAP_ARRAYS(UINT64, uint64_t);
    SHALLOW_SWAP_ARRAYS(FLOAT, float);
    SHALLOW_SWAP_ARRAYS(DOUBLE, double);
    SHALLOW_SWAP_ARRAYS(BOOL, bool);
    SHALLOW_SWAP_ARRAYS(ENUM, int);
#undef SHALLOW_SWAP_ARRAYS

    case FieldDescriptor::CPPTYPE_STRING:
      internal::SwapFieldHelper::SwapRepeatedStringField<true>(this, message1,
                                                               message2, field);
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      internal::SwapFieldHelper::SwapRepeatedMessageField<true>(
          this, message1, message2, field);
      break;

    default:
      ABSL_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
  }
}